

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O1

EventSignalPtr * __thiscall entityx::EventManager::signal_for(EventManager *this,size_t id)

{
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *this_00;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long lVar4;
  undefined1 local_29;
  Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = (vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
             *)(this + 8);
  if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 4) <= id) {
    Catch::clara::std::
    vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
    ::resize(this_00,id + 1);
  }
  lVar4 = id * 0x10;
  if (*(long *)(*(long *)this_00 + lVar4) == 0) {
    local_28 = (Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,std::allocator<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>>
              (&_Stack_20,&local_28,
               (allocator<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                *)&local_29);
    _Var3._M_pi = _Stack_20._M_pi;
    pSVar2 = local_28;
    local_28 = (Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this_00 + 8 + lVar4);
    puVar1 = (undefined8 *)(*(long *)this_00 + lVar4);
    *puVar1 = pSVar2;
    puVar1[1] = _Var3._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  return (EventSignalPtr *)(lVar4 + *(long *)this_00);
}

Assistant:

EventSignalPtr &signal_for(std::size_t id) {
    if (id >= handlers_.size())
      handlers_.resize(id + 1);
    if (!handlers_[id])
      handlers_[id] = std::make_shared<EventSignal>();
    return handlers_[id];
  }